

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::TimeZoneNamesImpl::addAllNamesIntoTrie(TimeZoneNamesImpl *this,UErrorCode *status)

{
  UHashElement *pUVar1;
  int32_t pos;
  int32_t local_2c;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  local_2c = -1;
  pUVar1 = uhash_nextElement_63(this->fMZNamesMap,&local_2c);
  if (pUVar1 != (UHashElement *)0x0) {
    do {
      if (((ZNames *)(pUVar1->value).pointer != (ZNames *)"<empty>") &&
         (ZNames::addNamesIntoTrie
                    ((ZNames *)(pUVar1->value).pointer,(UChar *)(pUVar1->key).pointer,(UChar *)0x0,
                     &this->fNamesTrie,status), U_ZERO_ERROR < *status)) {
        return;
      }
      pUVar1 = uhash_nextElement_63(this->fMZNamesMap,&local_2c);
    } while (pUVar1 != (UHashElement *)0x0);
  }
  local_2c = -1;
  pUVar1 = uhash_nextElement_63(this->fTZNamesMap,&local_2c);
  if (pUVar1 != (UHashElement *)0x0) {
    do {
      if (((ZNames *)(pUVar1->value).pointer != (ZNames *)"<empty>") &&
         (ZNames::addNamesIntoTrie
                    ((ZNames *)(pUVar1->value).pointer,(UChar *)0x0,(UChar *)(pUVar1->key).pointer,
                     &this->fNamesTrie,status), U_ZERO_ERROR < *status)) {
        return;
      }
      pUVar1 = uhash_nextElement_63(this->fTZNamesMap,&local_2c);
    } while (pUVar1 != (UHashElement *)0x0);
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }